

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O0

void __thiscall
cpp_bindgen::cpp_bindgen::anon_unknown_0::FortranArrayView_CArrayReferenceIsBindable_Test::TestBody
          (FortranArrayView_CArrayReferenceIsBindable_Test *this)

{
  bool bVar1;
  char *message;
  int *local_190;
  AssertHelper local_188;
  Message local_180 [2];
  runtime_error *anon_var_0_3;
  char *pcStack_168;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_158 [2];
  runtime_error *anon_var_0_2;
  char *pcStack_140;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_130 [2];
  runtime_error *anon_var_0_1;
  char *pcStack_118;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_108 [2];
  runtime_error *anon_var_0;
  char *pcStack_f0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  float (*view) [1] [2] [3] [4];
  bindgen_fortran_array_descriptor descriptor;
  float data [1] [2] [3] [4];
  FortranArrayView_CArrayReferenceIsBindable_Test *this_local;
  
  view._0_4_ = 5;
  view._4_4_ = 4;
  descriptor.type = bindgen_fk_LongLong;
  descriptor.rank = 3;
  descriptor.dims[0] = 2;
  descriptor.dims[1] = 1;
  local_190 = descriptor.dims + 2;
  do {
    *local_190 = 0;
    local_190 = local_190 + 1;
  } while (local_190 != descriptor.dims + 5);
  descriptor._32_8_ = &descriptor.is_acc_present;
  descriptor.data._0_1_ = 0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       make_fortran_array_view<float(&)[1][2][3][4]>((bindgen_fortran_array_descriptor *)&view);
  testing::internal::EqHelper<false>::Compare<float[1][2][3][4],void*>
            ((EqHelper<false> *)local_c8,"view","descriptor.data",
             (float (*) [1] [2] [3] [4])gtest_ar.message_.ptr_,(void **)(descriptor.dims + 6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
               ,0x90,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff10);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      make_fortran_array_view<float(&)[1][2][3][3]>((bindgen_fortran_array_descriptor *)&view);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_f0 = 
      "Expected: make_fortran_array_view<float(&)[1][2][3][3]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
      ;
      goto LAB_0010bd2c;
    }
  }
  else {
LAB_0010bd2c:
    testing::Message::Message(local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
               ,0x92,pcStack_f0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_108);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffee8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffee8);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      make_fortran_array_view<float(&)[2][2][3][4]>((bindgen_fortran_array_descriptor *)&view);
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_118 = 
      "Expected: make_fortran_array_view<float(&)[2][2][3][4]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
      ;
      goto LAB_0010bebb;
    }
  }
  else {
LAB_0010bebb:
    testing::Message::Message(local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
               ,0x93,pcStack_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_130);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffec0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffec0);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      make_fortran_array_view<float(&)[1][2][3]>((bindgen_fortran_array_descriptor *)&view);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) goto LAB_0010c0ee;
    pcStack_140 = 
    "Expected: make_fortran_array_view<float(&)[1][2][3]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_158);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
             ,0x94,pcStack_140);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,local_158);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
  testing::Message::~Message(local_158);
LAB_0010c0ee:
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe98);
  if (bVar1) {
    anon_var_0_3._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      make_fortran_array_view<float(&)[1][2][3][4][5]>((bindgen_fortran_array_descriptor *)&view);
    }
    if ((anon_var_0_3._7_1_ & 1) != 0) {
      return;
    }
    pcStack_168 = 
    "Expected: make_fortran_array_view<float(&)[1][2][3][4][5]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_180);
  testing::internal::AssertHelper::AssertHelper
            (&local_188,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
             ,0x95,pcStack_168);
  testing::internal::AssertHelper::operator=(&local_188,local_180);
  testing::internal::AssertHelper::~AssertHelper(&local_188);
  testing::Message::~Message(local_180);
  return;
}

Assistant:

TEST(FortranArrayView, CArrayReferenceIsBindable) {
                float data[1][2][3][4];
                bindgen_fortran_array_descriptor descriptor{bindgen_fk_Float, 4, {4, 3, 2, 1}, &data[0]};

                auto &view = make_fortran_array_view<float(&)[1][2][3][4]>(&descriptor);
                static_assert(std::is_same<decltype(view), float(&)[1][2][3][4]>::value, "");
                EXPECT_EQ(view, descriptor.data);

                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3][3]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[2][2][3][4]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3][4][5]>(&descriptor), std::runtime_error);
            }